

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O1

int nghttp2_frame_add_pad(nghttp2_bufs *bufs,nghttp2_frame_hd *hd,size_t padlen,int framehd_only)

{
  ulong __n;
  byte *pbVar1;
  uint8_t **ppuVar2;
  nghttp2_buf_chain *pnVar3;
  uint8_t *puVar4;
  uint32_t uVar5;
  
  if (padlen != 0) {
    pnVar3 = bufs->head;
    __n = padlen - 1;
    if ((ulong)((long)(pnVar3->buf).end - (long)(pnVar3->buf).last) < __n) {
      __assert_fail("nghttp2_buf_avail(buf) >= padlen - 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                    ,0x4c5,
                    "int nghttp2_frame_add_pad(nghttp2_bufs *, nghttp2_frame_hd *, size_t, int)");
    }
    puVar4 = (pnVar3->buf).pos;
    *(undefined8 *)(puVar4 + -1) = *(undefined8 *)puVar4;
    puVar4[7] = puVar4[8];
    puVar4 = (pnVar3->buf).pos;
    (pnVar3->buf).pos = puVar4 + -1;
    pbVar1 = puVar4 + 3;
    *pbVar1 = *pbVar1 | 8;
    uVar5 = nghttp2_get_uint32((pnVar3->buf).pos);
    puVar4 = (pnVar3->buf).pos;
    nghttp2_put_uint32be(puVar4,(uint)puVar4[3] | ((uVar5 >> 8) + (int)padlen) * 0x100);
    if (framehd_only == 0) {
      (pnVar3->buf).pos[9] = (uint8_t)__n;
      memset((pnVar3->buf).last,0,__n);
      ppuVar2 = &(pnVar3->buf).last;
      *ppuVar2 = *ppuVar2 + __n;
    }
    hd->length = hd->length + padlen;
    hd->flags = hd->flags | 8;
  }
  return 0;
}

Assistant:

int nghttp2_frame_add_pad(nghttp2_bufs *bufs, nghttp2_frame_hd *hd,
                          size_t padlen, int framehd_only) {
  nghttp2_buf *buf;

  if (padlen == 0) {
    DEBUGF("send: padlen = 0, nothing to do\n");

    return 0;
  }

  /*
   * We have arranged bufs like this:
   *
   *  0                   1                   2                   3
   *  0 1 2 3 4 5 6 7 8 9 0 1 2 3 4 5 6 7 8 9 0 1 2 3 4 5 6 7 8 9 0 1
   * +-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+
   * | |Frame header     | Frame payload...                          :
   * +-+-----------------+-------------------------------------------+
   * | |Frame header     | Frame payload...                          :
   * +-+-----------------+-------------------------------------------+
   * | |Frame header     | Frame payload...                          :
   * +-+-----------------+-------------------------------------------+
   *
   * We arranged padding so that it is included in the first frame
   * completely.  For padded frame, we are going to adjust buf->pos of
   * frame which includes padding and serialize (memmove) frame header
   * in the correct position.  Also extends buf->last to include
   * padding.
   */

  buf = &bufs->head->buf;

  assert(nghttp2_buf_avail(buf) >= padlen - 1);

  frame_set_pad(buf, padlen, framehd_only);

  hd->length += padlen;
  hd->flags |= NGHTTP2_FLAG_PADDED;

  DEBUGF("send: final payloadlen=%zu, padlen=%zu\n", hd->length, padlen);

  return 0;
}